

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_put(void *src,void *dst,int bytes,int proc,comex_group_t group)

{
  int iVar1;
  undefined8 in_RAX;
  char *__assertion;
  int size;
  int world_proc;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = comex_group_size(group,(int *)&local_38);
  if (iVar1 == 0) {
    if (proc < 0) {
      __assertion = "proc >= 0";
    }
    else {
      if (proc < (int)local_38) {
        if (group != 0) {
          comex_group_translate_world(group,proc,(int *)((long)&local_38 + 4));
          proc = local_38._4_4_;
        }
        _put_nbi(src,dst,bytes,proc);
        comex_make_progress();
        return 0;
      }
      __assertion = "proc < size";
    }
  }
  else {
    __assertion = "COMEX_SUCCESS == ierr";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x260,"int comex_put(void *, void *, int, int, comex_group_t)");
}

Assistant:

int comex_put(void *src, void *dst, int bytes, int proc, comex_group_t group)
{
    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_put(src=%p, dst=%p, bytes=%d, proc=%d, group=%d)\n",
            l_state.rank, src, dst, bytes, proc, group);
#endif
    _put_nbi(src, dst, bytes, proc);
    comex_wait_proc(proc, group);
    return COMEX_SUCCESS;
}